

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O3

IOTHUB_ACCOUNT_INFO_HANDLE
IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG *config,_Bool testingModules)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  IOTHUB_ACCOUNT_INFO *accountInfo;
  IOTHUB_PROVISIONED_DEVICE **ppIVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  LOGGER_LOG p_Var7;
  char *__dest;
  char *pcVar8;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle;
  IOTHUB_MESSAGING_HANDLE pIVar9;
  IOTHUB_REGISTRYMANAGER_HANDLE pIVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  int endHost;
  int beginHost;
  int local_50;
  int endIothub;
  int endName;
  int beginName;
  char *local_40;
  int beginIothub;
  
  if (config == (IOTHUB_ACCOUNT_CONFIG *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar4 = "[IoTHubAccount] invalid configuration (NULL)";
    iVar2 = 0x28a;
LAB_0011ea9c:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
              ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar4);
    return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
  }
  accountInfo = (IOTHUB_ACCOUNT_INFO *)calloc(1,0xc0);
  if (accountInfo == (IOTHUB_ACCOUNT_INFO *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar4 = "[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.";
    iVar2 = 0x293;
    goto LAB_0011ea9c;
  }
  sVar11 = config->number_of_sas_devices;
  ppIVar3 = (IOTHUB_PROVISIONED_DEVICE **)calloc(1,sVar11 * 8);
  accountInfo->sasDevices = ppIVar3;
  if (ppIVar3 == (IOTHUB_PROVISIONED_DEVICE **)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ee25;
    pcVar4 = "[IoTHubAccount] Failed allocating array for SAS devices";
    iVar2 = 0x29e;
  }
  else {
    accountInfo->number_of_sas_devices = sVar11;
    pcVar4 = getenv("IOTHUB_CONNECTION_STRING");
    accountInfo->connString = pcVar4;
    pcVar5 = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
    accountInfo->eventhubConnString = pcVar5;
    getenv("IOTHUB_E2E_X509_CERT_BASE64");
    getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
    getenv("IOTHUB_E2E_X509_THUMBPRINT");
    if (pcVar4 == (char *)0x0) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ee25;
      pcVar4 = "Failure retrieving IoT Hub connection string from the environment.\r\n";
      iVar2 = 0x2b7;
    }
    else if (pcVar5 == (char *)0x0) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ee25;
      pcVar4 = "Failure retrieving Event Hub connection string from the environment.\r\n";
      iVar2 = 0x2bd;
    }
    else {
      sVar6 = strlen(pcVar4);
      iVar1 = __isoc99_sscanf(pcVar4,
                              "HostName=%n%*[^.]%n.%n%*[^;];%nSharedAccessKeyName=%n%*[^;];%nSharedAccessKey=%n"
                              ,&beginHost,&endHost,&beginIothub,&endIothub,&beginName,&endName,
                              &local_50);
      iVar2 = beginHost;
      if (iVar1 == 0) {
        lVar12 = (long)endHost;
        lVar13 = (long)beginHost;
        pcVar5 = (char *)malloc((long)((endHost - beginHost) + 1));
        accountInfo->iothubName = pcVar5;
        if (pcVar5 == (char *)0x0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar4 = "Failure allocating iothubName.\r\n";
            iVar2 = 0x9f;
            goto LAB_0011ea2c;
          }
        }
        else {
          __dest = (char *)malloc((long)((endIothub - iVar2) + 1));
          accountInfo->hostname = __dest;
          if (__dest == (char *)0x0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                        ,"retrieveConnStringInfo",0xa4,1,"Failure allocating hostname.\r\n");
            }
          }
          else {
            local_40 = (char *)malloc((long)((endName - beginName) + 1));
            accountInfo->keyName = local_40;
            if (local_40 == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"retrieveConnStringInfo",0xaa,1,"Failure allocating keyname.\r\n");
              }
            }
            else {
              pcVar8 = (char *)malloc((sVar6 - (long)local_50) + 2);
              __ptr = local_40;
              accountInfo->sharedAccessKey = pcVar8;
              if (pcVar8 != (char *)0x0) {
                iVar2 = __isoc99_sscanf(pcVar4,
                                        "HostName=%[^.].%[^;];SharedAccessKeyName=%[^;];SharedAccessKey=%s"
                                        ,pcVar5,__dest + (lVar12 - lVar13) + 1,local_40,pcVar8);
                if (iVar2 == 4) {
                  strcpy(__dest,pcVar5);
                  sVar11 = (size_t)beginHost;
                  __dest[(long)endHost - sVar11] = '.';
                  iVar2 = mallocAndStrcpy_s(&accountInfo->iothubSuffix,
                                            __dest + ((long)endHost - sVar11) + 1);
                  if (iVar2 == 0) {
                    serviceClientHandle =
                         IoTHubServiceClientAuth_CreateFromConnectionString(accountInfo->connString)
                    ;
                    accountInfo->iothub_service_client_auth_handle = serviceClientHandle;
                    if (serviceClientHandle != (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
                      pIVar9 = IoTHubMessaging_LL_Create(serviceClientHandle);
                      accountInfo->iothub_messaging_handle = pIVar9;
                      if (pIVar9 == (IOTHUB_MESSAGING_HANDLE)0x0) {
                        p_Var7 = xlogging_get_log_function();
                        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ef60;
                        pcVar4 = "IoTHubMessaging_LL_Create failed\r\n";
                        iVar2 = 0x2fe;
                      }
                      else {
                        pIVar10 = IoTHubRegistryManager_Create
                                            (accountInfo->iothub_service_client_auth_handle);
                        accountInfo->iothub_registrymanager_handle = pIVar10;
                        if (pIVar10 == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
                          p_Var7 = xlogging_get_log_function();
                          if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ef60;
                          pcVar4 = "IoTHubRegistryManager_Create failed\r\n";
                          iVar2 = 0x307;
                        }
                        else {
                          iVar2 = provisionDevices(accountInfo,
                                                   (IOTHUB_ACCOUNT_AUTH_METHOD)
                                                   accountInfo->sasDevices,
                                                   (IOTHUB_PROVISIONED_DEVICE **)
                                                   accountInfo->number_of_sas_devices,sVar11);
                          if (iVar2 == 0) {
                            return accountInfo;
                          }
                          p_Var7 = xlogging_get_log_function();
                          if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ef60;
                          pcVar4 = "Failed to create the SAS device(s)\r\n";
                          iVar2 = 0x30f;
                        }
                      }
                      (*p_Var7)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar4);
LAB_0011ef60:
                      IoTHubAccount_deinit(accountInfo);
                      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
                    }
                    p_Var7 = xlogging_get_log_function();
                    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ee25;
                    pcVar4 = "IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n";
                    iVar2 = 0x2f5;
                    goto LAB_0011ee1a;
                  }
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    (*p_Var7)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                              ,"retrieveConnStringInfo",0xc9,1,
                              "[IoTHubAccount] Failure constructing the iothubSuffix.");
                  }
                  free(accountInfo->iothubName);
                  free(accountInfo->hostname);
                  free(accountInfo->keyName);
                  pcVar5 = accountInfo->sharedAccessKey;
                }
                else {
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    (*p_Var7)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                              ,"retrieveConnStringInfo",0xbc,1,
                              "Failure determining the string values.\r\n");
                  }
                  free(pcVar5);
                  free(__dest);
                  free(__ptr);
                  pcVar5 = pcVar8;
                }
                goto LAB_0011edec;
              }
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"retrieveConnStringInfo",0xb1,1,
                          "Failure allocating shared access key.\r\n");
              }
              free(pcVar5);
              pcVar5 = local_40;
            }
            free(pcVar5);
            pcVar5 = __dest;
          }
LAB_0011edec:
          free(pcVar5);
        }
      }
      else {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar4 = "Failure determining the string length parameters.\r\n";
          iVar2 = 0x98;
LAB_0011ea2c:
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"retrieveConnStringInfo",iVar2,1,pcVar4);
        }
      }
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0011ee25;
      pcVar4 = "retrieveConnStringInfo failed.\r\n";
      iVar2 = 0x2ec;
    }
  }
LAB_0011ee1a:
  (*p_Var7)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
            ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar4);
LAB_0011ee25:
  free(accountInfo);
  return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
}

Assistant:

IOTHUB_ACCOUNT_INFO_HANDLE IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG* config, bool testingModules)
{
    (void)testingModules;
    IOTHUB_ACCOUNT_INFO* iothub_account_info;

    if (config == NULL)
    {
        LogError("[IoTHubAccount] invalid configuration (NULL)");
        iothub_account_info = NULL;
    }
    else
    {
        iothub_account_info = malloc(sizeof(IOTHUB_ACCOUNT_INFO));

        if (iothub_account_info == NULL)
        {
            LogError("[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.");
        }
        else
        {
            char* base64_cert;
            char* base64_key;
            char* tempThumb;
            memset(iothub_account_info, 0, sizeof(IOTHUB_ACCOUNT_INFO));

            if ((iothub_account_info->sasDevices = (IOTHUB_PROVISIONED_DEVICE**)malloc(sizeof(IOTHUB_PROVISIONED_DEVICE*) * config->number_of_sas_devices)) == NULL)
            {
                LogError("[IoTHubAccount] Failed allocating array for SAS devices");
                free(iothub_account_info);
                iothub_account_info = NULL;
            }
            else
            {
                iothub_account_info->number_of_sas_devices = config->number_of_sas_devices;
                memset(iothub_account_info->sasDevices, 0, sizeof(IOTHUB_PROVISIONED_DEVICE*) * iothub_account_info->number_of_sas_devices);

#ifdef MBED_BUILD_TIMESTAMP
                iothub_account_info->connString = getMbedParameter("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getMbedParameter("IOTHUB_EVENTHUB_CONNECTION_STRING");
                tempCert = getMbedParameter("IOTHUB_E2E_X509_CERT");
                tempKey = getMbedParameter("IOTHUB_E2E_X509_PRIVATE_KEY");
                tempThump = getMbedParameter("IOTHUB_E2E_X509_THUMBPRINT");
#else
                iothub_account_info->connString = getenv("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
                base64_cert = getenv("IOTHUB_E2E_X509_CERT_BASE64");
                base64_key = getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
                tempThumb = getenv("IOTHUB_E2E_X509_THUMBPRINT");
#endif

                if (iothub_account_info->connString == NULL)
                {
                    LogError("Failure retrieving IoT Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (iothub_account_info->eventhubConnString == NULL)
                {
                    LogError("Failure retrieving Event Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                /*else if (base64_cert == NULL)
                {
                    LogError("Failure retrieving x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (base64_key == NULL)
                {
                    LogError("Failure retrieving x509 private key from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (tempThumb == NULL)
                {
                    LogError("Failure retrieving x509 certificate thumbprint from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509Certificate = convert_base64_to_string(base64_cert)) == NULL)
                {
                    LogError("Failure allocating x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509PrivateKey = convert_base64_to_string(base64_key)) == NULL)
                {
                    LogError("Failure allocating x509 key from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (mallocAndStrcpy_s(&iothub_account_info->x509Thumbprint, tempThumb) != 0)
                {
                    LogError("Failure allocating x509 thumb print from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info->x509PrivateKey);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }*/
                else
                {
                    if (retrieveConnStringInfo(iothub_account_info) != 0)
                    {
                        LogError("retrieveConnStringInfo failed.\r\n");
                        free(iothub_account_info);
                        iothub_account_info = NULL;
                    }
                    else
                    {
                        iothub_account_info->iothub_service_client_auth_handle = IoTHubServiceClientAuth_CreateFromConnectionString(iothub_account_info->connString);
                        if (iothub_account_info->iothub_service_client_auth_handle == NULL)
                        {
                            LogError("IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n");
                            free(iothub_account_info);
                            iothub_account_info = NULL;
                        }
                        else
                        {
                            iothub_account_info->iothub_messaging_handle = IoTHubMessaging_LL_Create(iothub_account_info->iothub_service_client_auth_handle);
                            if (iothub_account_info->iothub_messaging_handle == NULL)
                            {
                                LogError("IoTHubMessaging_LL_Create failed\r\n");
                                IoTHubAccount_deinit(iothub_account_info);
                                iothub_account_info = NULL;
                            }
                            else
                            {
                                iothub_account_info->iothub_registrymanager_handle = IoTHubRegistryManager_Create(iothub_account_info->iothub_service_client_auth_handle);
                                if (iothub_account_info->iothub_registrymanager_handle == NULL)
                                {
                                    LogError("IoTHubRegistryManager_Create failed\r\n");
                                    IoTHubAccount_deinit(iothub_account_info);
                                    iothub_account_info = NULL;
                                }
                                else
                                {
                                    if (provisionDevices(iothub_account_info, IOTHUB_ACCOUNT_AUTH_CONNSTRING, iothub_account_info->sasDevices, iothub_account_info->number_of_sas_devices) != 0)
                                    {
                                        LogError("Failed to create the SAS device(s)\r\n");
                                        IoTHubAccount_deinit(iothub_account_info);
                                        iothub_account_info = NULL;
                                    }
                                    //else if (provisionDevice(iothub_account_info, IOTHUB_ACCOUNT_AUTH_X509, &iothub_account_info->x509Device) != 0)
                                    //{
                                    //    LogError("Failed to create the X509 device\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                    //else if (testingModules && provisionModule(iothub_account_info, iothub_account_info->sasDevices[0]))
                                    //{
                                    //    LogError("Failed to create the module\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return (IOTHUB_ACCOUNT_INFO_HANDLE)iothub_account_info;
}